

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerators::ReadOldMocDefinitionsFile
          (cmQtAutoGenerators *this,cmMakefile *makefile,string *targetDirectory)

{
  char *pcVar1;
  bool bVar2;
  char *__s;
  string filename;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::CollapseFullPath(&local_40,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_40);
  std::__cxx11::string::append((char *)&local_40);
  bVar2 = cmMakefile::ReadListFile(makefile,local_40._M_dataplus._M_p);
  if (bVar2) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"AM_OLD_COMPILE_SETTINGS","");
    __s = cmMakefile::GetSafeDefinition(makefile,&local_60);
    pcVar1 = (char *)(this->OldCompileSettingsStr)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->OldCompileSettingsStr,0,pcVar1,(ulong)__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmQtAutoGenerators::ReadOldMocDefinitionsFile(cmMakefile* makefile,
                                            const std::string& targetDirectory)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutomocOldMocDefinitions.cmake";

  if (makefile->ReadListFile(filename.c_str()))
    {
    this->OldCompileSettingsStr =
                        makefile->GetSafeDefinition("AM_OLD_COMPILE_SETTINGS");
    }
  return true;
}